

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

sftp_request * fxp_read_send(fxp_handle *handle,uint64_t offset,int len)

{
  sftp_request *psVar1;
  sftp_packet *pkt;
  sftp_packet *pktout;
  sftp_request *req;
  int len_local;
  uint64_t offset_local;
  fxp_handle *handle_local;
  
  psVar1 = sftp_alloc_request();
  pkt = sftp_pkt_init(5);
  BinarySink_put_uint32(pkt->binarysink_,(ulong)psVar1->id);
  BinarySink_put_string(pkt->binarysink_,handle->hstring,(long)handle->hlen);
  BinarySink_put_uint64(pkt->binarysink_,offset);
  BinarySink_put_uint32(pkt->binarysink_,(long)len);
  sftp_send(pkt);
  return psVar1;
}

Assistant:

struct sftp_request *fxp_read_send(struct fxp_handle *handle,
                                   uint64_t offset, int len)
{
    struct sftp_request *req = sftp_alloc_request();
    struct sftp_packet *pktout;

    pktout = sftp_pkt_init(SSH_FXP_READ);
    put_uint32(pktout, req->id);
    put_string(pktout, handle->hstring, handle->hlen);
    put_uint64(pktout, offset);
    put_uint32(pktout, len);
    sftp_send(pktout);

    return req;
}